

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubkey.h
# Opt level: O2

bool operator<(CExtPubKey *a,CExtPubKey *b)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = operator<(&a->pubkey,&b->pubkey);
  bVar3 = true;
  if (!bVar2) {
    bVar2 = operator>(&a->pubkey,&b->pubkey);
    if (!bVar2) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        bVar2 = operator<(&(a->chaincode).super_base_blob<256U>,
                          &(b->chaincode).super_base_blob<256U>);
        return bVar2;
      }
      goto LAB_00322a62;
    }
    bVar3 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
LAB_00322a62:
  __stack_chk_fail();
}

Assistant:

bool operator<(const CExtPubKey &a, const CExtPubKey &b)
    {
        if (a.pubkey < b.pubkey) {
            return true;
        } else if (a.pubkey > b.pubkey) {
            return false;
        }
        return a.chaincode < b.chaincode;
    }